

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O3

void CPU::WDC65816::ProcessorStorageConstructor::absolute_x_rmw
               (AccessType param_1,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  undefined8 in_RAX;
  undefined1 auStack_18 [5];
  undefined1 local_13;
  MicroOp local_12;
  MicroOp local_11;
  
  _local_13 = (undefined3)((ulong)in_RAX >> 0x28);
  auStack_18 = (undefined1  [5])CONCAT14(0,(int)in_RAX);
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,auStack_18 + 4);
    _auStack_18 = (uint6)(uint5)auStack_18;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,&local_13);
      _auStack_18 = CONCAT16(0x20,_auStack_18);
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,&local_12);
        _auStack_18 = CONCAT17(8,_auStack_18);
        if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*target->_M_invoker)((_Any_data *)target,&local_11);
          read_modify_write(is8bit,target);
          return;
        }
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

static void absolute_x_rmw(AccessType, bool is8bit, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);					// AAL.
		target(CycleFetchIncrementPC);					// AAH.

		target(OperationConstructAbsoluteX);			// Calculate data address.
		target(CycleFetchIncorrectDataAddress);			// Perform dummy read.

		read_modify_write(is8bit, target);
	}